

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O0

ALLEGRO_FS_ENTRY * create_abs_path_entry(WRAP_CHAR *abs_path)

{
  _Bool _Var1;
  ALLEGRO_FS_ENTRY *fp;
  size_t sVar2;
  char *file;
  ALLEGRO_FS_INTERFACE *pAVar3;
  char *in_RDI;
  size_t len;
  ALLEGRO_FS_ENTRY_STDIO *fh;
  int in_stack_00000024;
  char *in_stack_00000028;
  int in_stack_00000034;
  char *in_stack_00000038;
  char *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  int errnum;
  undefined8 in_stack_ffffffffffffffe8;
  size_t in_stack_fffffffffffffff8;
  
  fp = (ALLEGRO_FS_ENTRY *)
       al_calloc_with_context
                 (in_stack_fffffffffffffff8,(size_t)in_RDI,
                  (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),in_stack_ffffffffffffffe0,
                  in_stack_ffffffffffffffd8);
  errnum = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  if (fp == (ALLEGRO_FS_ENTRY *)0x0) {
    __errno_location();
    al_set_errno(errnum);
    fp = (ALLEGRO_FS_ENTRY *)0x0;
  }
  else {
    fp->vtable = &_al_fs_interface_stdio;
    sVar2 = strlen(in_RDI);
    file = (char *)(sVar2 + 1);
    pAVar3 = (ALLEGRO_FS_INTERFACE *)
             al_malloc_with_context
                       ((size_t)fp,(int)((ulong)file >> 0x20),in_stack_ffffffffffffffd8,
                        (char *)0x177ff5);
    fp[1].vtable = pAVar3;
    if (fp[1].vtable == (ALLEGRO_FS_INTERFACE *)0x0) {
      al_free_with_context(in_RDI,(int)((ulong)fp >> 0x20),file,in_stack_ffffffffffffffd8);
      fp = (ALLEGRO_FS_ENTRY *)0x0;
    }
    else {
      memcpy(fp[1].vtable,in_RDI,(size_t)file);
      _Var1 = _al_trace_prefix(in_stack_00000038,in_stack_00000034,in_stack_00000028,
                               in_stack_00000024,abs_path);
      if (_Var1) {
        _al_trace_suffix("Creating entry for %s\n",fp[1].vtable);
      }
      fs_stdio_update_entry(fp);
    }
  }
  return fp;
}

Assistant:

static ALLEGRO_FS_ENTRY *create_abs_path_entry(const WRAP_CHAR *abs_path)
{
   ALLEGRO_FS_ENTRY_STDIO *fh;
   size_t len;

   fh = al_calloc(1, sizeof(*fh));
   if (!fh) {
      al_set_errno(errno);
      return NULL;
   }

   fh->fs_entry.vtable = &_al_fs_interface_stdio;

   len = WRAP_STRLEN(abs_path) + 1; /* including terminator */
   fh->abs_path = al_malloc(len * sizeof(WRAP_CHAR));
   if (!fh->abs_path) {
      al_free(fh);
      return NULL;
   }
   memcpy(fh->abs_path, abs_path, len * sizeof(WRAP_CHAR));

#ifdef ALLEGRO_WINDOWS
   fh->abs_path_utf8 = _al_win_utf16_to_utf8(fh->abs_path);
   if (!fh->abs_path_utf8) {
      al_free(fh->abs_path);
      al_free(fh);
      return NULL;
   }
#endif

   ALLEGRO_DEBUG("Creating entry for %s\n", fh->ABS_PATH_UTF8);

   fs_stdio_update_entry((ALLEGRO_FS_ENTRY *) fh);

   return (ALLEGRO_FS_ENTRY *) fh;
}